

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walIndexRecover(Wal *pWal)

{
  undefined8 uVar1;
  u32 uVar2;
  u32 *puVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  u8 *aFrame;
  int iVar7;
  long lVar8;
  sqlite3_int64 sVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  long in_FS_OFFSET;
  undefined4 uVar14;
  undefined4 uVar15;
  i64 nSize;
  u32 nTruncate;
  u32 pgno;
  u8 aBuf [32];
  u32 local_a8;
  long local_88;
  u32 local_80;
  u32 local_7c;
  undefined8 local_78;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  ulong local_68;
  u8 *local_60;
  undefined4 local_58;
  uint local_54;
  undefined4 local_50;
  uint local_4c;
  undefined8 local_48;
  uint local_40;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar11 = 7 - (uint)pWal->ckptLock;
  iVar10 = pWal->ckptLock + 1;
  if ((pWal->exclusiveMode == '\0') &&
     (iVar4 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar10,iVar11,10), iVar4 != 0))
  goto LAB_001feb13;
  (pWal->hdr).aSalt[0] = 0;
  (pWal->hdr).aSalt[1] = 0;
  (pWal->hdr).aCksum[0] = 0;
  (pWal->hdr).aCksum[1] = 0;
  (pWal->hdr).mxFrame = 0;
  (pWal->hdr).nPage = 0;
  (pWal->hdr).aFrameCksum[0] = 0;
  (pWal->hdr).aFrameCksum[1] = 0;
  (pWal->hdr).iVersion = 0;
  (pWal->hdr).unused = 0;
  (pWal->hdr).iChange = 0;
  (pWal->hdr).isInit = '\0';
  (pWal->hdr).bigEndCksum = '\0';
  (pWal->hdr).szPage = 0;
  iVar4 = (*pWal->pWalFd->pMethods->xFileSize)(pWal->pWalFd,&local_88);
  if (iVar4 == 0) {
    if (local_88 < 0x21) {
      uVar14 = 0;
      uVar15 = 0;
    }
    else {
      iVar4 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,&local_58,0x20,0);
      if (iVar4 != 0) goto LAB_001feaf9;
      uVar14 = 0;
      uVar15 = 0;
      if ((local_58._3_1_ & 0xfffffffe |
          (local_58 >> 0x10 & 0xff) << 8 | (local_58 >> 8 & 0xff) << 0x10 | local_58 << 0x18) ==
          0x377f0682) {
        local_78 = (ulong)(local_50 * 0x1000000);
        iVar7 = (local_50 >> 8 & 0xff) * 0x10000;
        iVar5 = local_50 * 0x1000000 + iVar7;
        uVar12 = (local_50 >> 0x10 & 0xff) * 0x100;
        uVar13 = iVar5 + (uint)local_50._3_1_ | uVar12;
        if (0xffff01fe < uVar13 - 0x10001 && (uVar13 & uVar13 - 1) == 0) {
          (pWal->hdr).bigEndCksum = (u8)(local_58._3_1_ & 1);
          pWal->szPage = uVar13;
          pWal->nCkpt = local_4c >> 0x18 | (local_4c & 0xff0000) >> 8 | (local_4c & 0xff00) << 8 |
                        local_4c << 0x18;
          *(undefined8 *)(pWal->hdr).aSalt = local_48;
          walChecksumBytes(local_58._3_1_ & 1 ^ 1,(u8 *)&local_58,0x18,(u32 *)0x0,
                           (pWal->hdr).aFrameCksum);
          uVar14 = 0;
          uVar15 = 0;
          if (((pWal->hdr).aFrameCksum[0] ==
               (local_40 >> 0x18 | (local_40 & 0xff0000) >> 8 | (local_40 & 0xff00) << 8 |
               local_40 << 0x18)) &&
             ((pWal->hdr).aFrameCksum[1] ==
              (local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
              local_3c << 0x18))) {
            if ((local_54 >> 0x18 | (local_54 & 0xff0000) >> 8 | (local_54 & 0xff00) << 8 |
                local_54 << 0x18) == 0x2de218) {
              iVar6 = sqlite3_initialize();
              iVar4 = 7;
              if (iVar6 == 0) {
                uVar13 = uVar13 + 0x18;
                aFrame = (u8 *)sqlite3Malloc((ulong)uVar13);
                if (aFrame != (u8 *)0x0) {
                  uStack_70 = 0;
                  uStack_6c = 0;
                  uVar14 = 0;
                  uVar15 = 0;
                  if ((long)((ulong)uVar13 + 0x20) <= local_88) {
                    local_60 = aFrame + 0x18;
                    local_68 = (ulong)((int)local_78 + iVar7 + uVar12 + (uint)local_50._3_1_ + 0x18)
                    ;
                    sVar9 = 0x20;
                    local_a8 = 1;
                    local_78._0_4_ = 0;
                    local_78._4_4_ = 0;
                    do {
                      iVar4 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,aFrame,uVar13,sVar9);
                      if (iVar4 != 0) {
LAB_001fec56:
                        sqlite3_free(aFrame);
                        goto LAB_001feaf9;
                      }
                      iVar4 = walDecodeFrame(pWal,&local_7c,&local_80,local_60,aFrame);
                      if (iVar4 == 0) goto LAB_001fea58;
                      iVar4 = walIndexAppend(pWal,local_a8,local_7c);
                      if (iVar4 != 0) goto LAB_001fec56;
                      if (local_80 != 0) {
                        (pWal->hdr).mxFrame = local_a8;
                        (pWal->hdr).nPage = local_80;
                        (pWal->hdr).szPage = (ushort)((uint)iVar5 >> 0x10) | (ushort)uVar12;
                        uVar1 = *(undefined8 *)(pWal->hdr).aFrameCksum;
                        local_78._0_4_ = (undefined4)uVar1;
                        local_78._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
                        uStack_70 = 0;
                        uStack_6c = 0;
                      }
                      sVar9 = sVar9 + local_68;
                      local_a8 = local_a8 + 1;
                      uVar14 = (undefined4)local_78;
                      uVar15 = local_78._4_4_;
                    } while ((long)(local_68 + sVar9) <= local_88);
                  }
                  local_78 = CONCAT44(uVar15,uVar14);
LAB_001fea58:
                  sqlite3_free(aFrame);
                  uVar14 = (undefined4)local_78;
                  uVar15 = local_78._4_4_;
                  goto LAB_001fea8a;
                }
              }
            }
            else {
              iVar4 = 0xe;
              sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xdb6b,
                          "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
            }
            goto LAB_001feaf9;
          }
        }
      }
    }
LAB_001fea8a:
    *(ulong *)(pWal->hdr).aFrameCksum = CONCAT44(uVar15,uVar14);
    walIndexWriteHdr(pWal);
    puVar3 = *pWal->apWiData;
    lVar8 = 0;
    puVar3[0x18] = 0;
    puVar3[0x20] = (pWal->hdr).mxFrame;
    puVar3[0x19] = 0;
    do {
      puVar3[lVar8 + 0x1a] = 0xffffffff;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    uVar2 = (pWal->hdr).mxFrame;
    if (uVar2 != 0) {
      puVar3[0x1a] = uVar2;
    }
    if ((pWal->hdr).nPage == 0) {
      iVar4 = 0;
    }
    else {
      iVar4 = 0;
      sqlite3_log(0x11b,"recovered %d frames from WAL file %s",(ulong)(pWal->hdr).mxFrame,
                  pWal->zWalName);
    }
  }
LAB_001feaf9:
  if (pWal->exclusiveMode == '\0') {
    (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar10,iVar11,9);
  }
LAB_001feb13:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar4;
}

Assistant:

static int walIndexRecover(Wal *pWal){
  int rc;                         /* Return Code */
  i64 nSize;                      /* Size of log file */
  u32 aFrameCksum[2] = {0, 0};
  int iLock;                      /* Lock offset to lock for checkpoint */
  int nLock;                      /* Number of locks to hold */

  /* Obtain an exclusive lock on all byte in the locking range not already
  ** locked by the caller. The caller is guaranteed to have locked the
  ** WAL_WRITE_LOCK byte, and may have also locked the WAL_CKPT_LOCK byte.
  ** If successful, the same bytes that are locked here are unlocked before
  ** this function returns.
  */
  assert( pWal->ckptLock==1 || pWal->ckptLock==0 );
  assert( WAL_ALL_BUT_WRITE==WAL_WRITE_LOCK+1 );
  assert( WAL_CKPT_LOCK==WAL_ALL_BUT_WRITE );
  assert( pWal->writeLock );
  iLock = WAL_ALL_BUT_WRITE + pWal->ckptLock;
  nLock = SQLITE_SHM_NLOCK - iLock;
  rc = walLockExclusive(pWal, iLock, nLock);
  if( rc ){
    return rc;
  }
  WALTRACE(("WAL%p: recovery begin...\n", pWal));

  memset(&pWal->hdr, 0, sizeof(WalIndexHdr));

  rc = sqlite3OsFileSize(pWal->pWalFd, &nSize);
  if( rc!=SQLITE_OK ){
    goto recovery_error;
  }

  if( nSize>WAL_HDRSIZE ){
    u8 aBuf[WAL_HDRSIZE];         /* Buffer to load WAL header into */
    u8 *aFrame = 0;               /* Malloc'd buffer to load entire frame */
    int szFrame;                  /* Number of bytes in buffer aFrame[] */
    u8 *aData;                    /* Pointer to data part of aFrame buffer */
    int iFrame;                   /* Index of last frame read */
    i64 iOffset;                  /* Next offset to read from log file */
    int szPage;                   /* Page size according to the log */
    u32 magic;                    /* Magic value read from WAL header */
    u32 version;                  /* Magic value read from WAL header */
    int isValid;                  /* True if this frame is valid */

    /* Read in the WAL header. */
    rc = sqlite3OsRead(pWal->pWalFd, aBuf, WAL_HDRSIZE, 0);
    if( rc!=SQLITE_OK ){
      goto recovery_error;
    }

    /* If the database page size is not a power of two, or is greater than
    ** SQLITE_MAX_PAGE_SIZE, conclude that the WAL file contains no valid 
    ** data. Similarly, if the 'magic' value is invalid, ignore the whole
    ** WAL file.
    */
    magic = sqlite3Get4byte(&aBuf[0]);
    szPage = sqlite3Get4byte(&aBuf[8]);
    if( (magic&0xFFFFFFFE)!=WAL_MAGIC 
     || szPage&(szPage-1) 
     || szPage>SQLITE_MAX_PAGE_SIZE 
     || szPage<512 
    ){
      goto finished;
    }
    pWal->hdr.bigEndCksum = (u8)(magic&0x00000001);
    pWal->szPage = szPage;
    pWal->nCkpt = sqlite3Get4byte(&aBuf[12]);
    memcpy(&pWal->hdr.aSalt, &aBuf[16], 8);

    /* Verify that the WAL header checksum is correct */
    walChecksumBytes(pWal->hdr.bigEndCksum==SQLITE_BIGENDIAN, 
        aBuf, WAL_HDRSIZE-2*4, 0, pWal->hdr.aFrameCksum
    );
    if( pWal->hdr.aFrameCksum[0]!=sqlite3Get4byte(&aBuf[24])
     || pWal->hdr.aFrameCksum[1]!=sqlite3Get4byte(&aBuf[28])
    ){
      goto finished;
    }

    /* Verify that the version number on the WAL format is one that
    ** are able to understand */
    version = sqlite3Get4byte(&aBuf[4]);
    if( version!=WAL_MAX_VERSION ){
      rc = SQLITE_CANTOPEN_BKPT;
      goto finished;
    }

    /* Malloc a buffer to read frames into. */
    szFrame = szPage + WAL_FRAME_HDRSIZE;
    aFrame = (u8 *)sqlite3_malloc64(szFrame);
    if( !aFrame ){
      rc = SQLITE_NOMEM_BKPT;
      goto recovery_error;
    }
    aData = &aFrame[WAL_FRAME_HDRSIZE];

    /* Read all frames from the log file. */
    iFrame = 0;
    for(iOffset=WAL_HDRSIZE; (iOffset+szFrame)<=nSize; iOffset+=szFrame){
      u32 pgno;                   /* Database page number for frame */
      u32 nTruncate;              /* dbsize field from frame header */

      /* Read and decode the next log frame. */
      iFrame++;
      rc = sqlite3OsRead(pWal->pWalFd, aFrame, szFrame, iOffset);
      if( rc!=SQLITE_OK ) break;
      isValid = walDecodeFrame(pWal, &pgno, &nTruncate, aData, aFrame);
      if( !isValid ) break;
      rc = walIndexAppend(pWal, iFrame, pgno);
      if( rc!=SQLITE_OK ) break;

      /* If nTruncate is non-zero, this is a commit record. */
      if( nTruncate ){
        pWal->hdr.mxFrame = iFrame;
        pWal->hdr.nPage = nTruncate;
        pWal->hdr.szPage = (u16)((szPage&0xff00) | (szPage>>16));
        testcase( szPage<=32768 );
        testcase( szPage>=65536 );
        aFrameCksum[0] = pWal->hdr.aFrameCksum[0];
        aFrameCksum[1] = pWal->hdr.aFrameCksum[1];
      }
    }

    sqlite3_free(aFrame);
  }

finished:
  if( rc==SQLITE_OK ){
    volatile WalCkptInfo *pInfo;
    int i;
    pWal->hdr.aFrameCksum[0] = aFrameCksum[0];
    pWal->hdr.aFrameCksum[1] = aFrameCksum[1];
    walIndexWriteHdr(pWal);

    /* Reset the checkpoint-header. This is safe because this thread is 
    ** currently holding locks that exclude all other readers, writers and
    ** checkpointers.
    */
    pInfo = walCkptInfo(pWal);
    pInfo->nBackfill = 0;
    pInfo->nBackfillAttempted = pWal->hdr.mxFrame;
    pInfo->aReadMark[0] = 0;
    for(i=1; i<WAL_NREADER; i++) pInfo->aReadMark[i] = READMARK_NOT_USED;
    if( pWal->hdr.mxFrame ) pInfo->aReadMark[1] = pWal->hdr.mxFrame;

    /* If more than one frame was recovered from the log file, report an
    ** event via sqlite3_log(). This is to help with identifying performance
    ** problems caused by applications routinely shutting down without
    ** checkpointing the log file.
    */
    if( pWal->hdr.nPage ){
      sqlite3_log(SQLITE_NOTICE_RECOVER_WAL,
          "recovered %d frames from WAL file %s",
          pWal->hdr.mxFrame, pWal->zWalName
      );
    }
  }

recovery_error:
  WALTRACE(("WAL%p: recovery %s\n", pWal, rc ? "failed" : "ok"));
  walUnlockExclusive(pWal, iLock, nLock);
  return rc;
}